

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O3

QString * QSqlQueryModelSql::et(QString *__return_storage_ptr__,QString *a,QString *b)

{
  long lVar1;
  Data *pDVar2;
  QString *pQVar3;
  long *plVar4;
  QArrayData *pQVar5;
  qsizetype *pqVar6;
  char16_t **ppcVar7;
  QArrayData *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  long local_78;
  char16_t *local_70;
  QArrayData *local_68;
  char16_t *local_60;
  long local_58;
  QArrayData *local_50;
  char16_t *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (a->d).size;
  if (lVar1 == 0) {
    pDVar2 = (b->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (b->d).ptr;
    (__return_storage_ptr__->d).size = (b->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00134f19;
  }
  pqVar6 = &(b->d).size;
  if (*pqVar6 == 0) {
    pDVar2 = (a->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (a->d).ptr;
    (__return_storage_ptr__->d).size = lVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00134f19;
  }
  QVar9.m_data = (storage_type *)0x3;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar9);
  local_68 = local_50;
  local_60 = local_48;
  local_58 = local_40;
  lVar1 = (a->d).size;
  local_78 = local_40;
  local_70 = local_48;
  pQVar8 = local_50;
  if (lVar1 == 0) {
LAB_00134dfb:
    if (pQVar8 == (QArrayData *)0x0) {
      pQVar8 = (QArrayData *)0x0;
    }
    else {
      LOCK();
      (((QArrayData *)&pQVar8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    if (local_40 == 0) {
      local_78 = lVar1;
      local_70 = (a->d).ptr;
      pQVar8 = &((a->d).d)->super_QArrayData;
      goto LAB_00134dfb;
    }
    local_50 = &((a->d).d)->super_QArrayData;
    local_48 = (a->d).ptr;
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar10.m_data = (char *)0x1;
    QVar10.m_size = (qsizetype)&local_50;
    local_40 = lVar1;
    pQVar3 = (QString *)QString::append(QVar10);
    plVar4 = (long *)QString::append(pQVar3);
    pQVar8 = (QArrayData *)*plVar4;
    local_70 = (char16_t *)plVar4[1];
    local_78 = plVar4[2];
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
  }
  if (local_78 == 0) {
    pQVar5 = &((b->d).d)->super_QArrayData;
    ppcVar7 = &(b->d).ptr;
LAB_00134ebf:
    (__return_storage_ptr__->d).d = (Data *)pQVar5;
    (__return_storage_ptr__->d).ptr = *ppcVar7;
    (__return_storage_ptr__->d).size = *pqVar6;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    if (*pqVar6 == 0) {
      ppcVar7 = &local_70;
      pQVar5 = pQVar8;
      pqVar6 = &local_78;
      goto LAB_00134ebf;
    }
    local_48 = local_70;
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar11.m_data = (char *)0x1;
    QVar11.m_size = (qsizetype)&local_50;
    local_50 = pQVar8;
    local_40 = local_78;
    pQVar3 = (QString *)QString::append(QVar11);
    plVar4 = (long *)QString::append(pQVar3);
    pDVar2 = (Data *)*plVar4;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (char16_t *)plVar4[1];
    (__return_storage_ptr__->d).size = plVar4[2];
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
  }
  if (pQVar8 != (QArrayData *)0x0) {
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar8,2,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
LAB_00134f19:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline const static QString et(const QString &a, const QString &b) { return a.isEmpty() ? b : b.isEmpty() ? a : concat(concat(a, et()), b); }